

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O3

void __thiscall hwtest::pgraph::anon_unknown_14::MthdSyfmSrcPos::emulate_mthd(MthdSyfmSrcPos *this)

{
  pgraph_state *state;
  uint32_t *puVar1;
  uint uVar2;
  uint32_t uVar3;
  int cstat;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[1] = uVar2;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[2][1] = uVar2 & 0xffff0000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xffffeeff |
       0x1000;
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][1];
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[0][1] = uVar3;
  cstat = nv03_pgraph_clip_status(state,uVar3,1,false);
  pgraph_set_xy_d(state,1,1,1,false,false,false,cstat);
  pgraph_prep_draw(state,false,false);
  puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_3;
  *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[0][1];
  pgraph_set_xy_d(state,1,1,1,false,(int)(short)uVar3 != uVar3,false,cstat);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_a =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[1][1] & 0x3ffff |
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_a & 0xfffc0000;
  return;
}

Assistant:

void emulate_mthd() override {
		exp.misc32[1] = val;
		exp.vtx_xy[2][1] = val & 0xffff0000;
		insrt(exp.valid[0], 12, 1, 1);
		insrt(exp.valid[0], 8, 1, 0);
		exp.vtx_xy[0][1] = exp.vtx_xy[4][1];
		int ycstat = nv03_pgraph_clip_status(&exp, exp.vtx_xy[0][1], 1, false);
		pgraph_set_xy_d(&exp, 1, 1, 1, false, false, false, ycstat);
		pgraph_prep_draw(&exp, false, false);
		insrt(exp.xy_misc_3, 0, 1, 0);
		pgraph_set_xy_d(&exp, 1, 1, 1, false, (int32_t)exp.vtx_xy[0][1] != (int16_t)exp.vtx_xy[0][1], false, ycstat);
		insrt(exp.xy_a, 0, 18, exp.vtx_xy[1][1]);
	}